

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O3

int Cut_CutFilterOld(Cut_Man_t *p,Cut_Cut_t *pList,Cut_Cut_t *pCut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  Cut_Cut_t **ppCVar6;
  Cut_Cut_t *pCVar7;
  
  uVar2 = *(uint *)pCut >> 0x1c;
  uVar3 = *(uint *)pList;
  uVar1 = uVar3 >> 0x1c;
  do {
    pCVar7 = pList;
    if ((pCVar7->uSign & ~pCut->uSign) == 0) {
      if (uVar3 < 0x10000000) {
LAB_0045475b:
        p->nCutsFilter = p->nCutsFilter + 1;
        Cut_CutRecycle(p,pCut);
        return 1;
      }
      uVar4 = 0;
      while( true ) {
        uVar5 = 0;
        if (0xfffffff < *(uint *)pCut) {
          uVar5 = 0;
          while (*(uint *)((long)&pCVar7[1].field_0x0 + uVar4 * 4) !=
                 *(uint *)(&pCut[1].field_0x0 + uVar5 * 4)) {
            uVar5 = uVar5 + 1;
            if (uVar2 == uVar5) goto LAB_004546a2;
          }
        }
        if ((uint)uVar5 == uVar2) break;
        uVar4 = uVar4 + 1;
        if (uVar4 == uVar1) goto LAB_0045475b;
      }
    }
LAB_004546a2:
    pList = pCVar7->pNext;
    if (pList == (Cut_Cut_t *)0x0) {
      return 0;
    }
    uVar3 = *(uint *)pList;
    uVar1 = uVar3 >> 0x1c;
  } while (uVar1 <= uVar2);
  if (pCVar7->pNext != pList) {
    __assert_fail("pPrev->pNext == pTemp",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutNode.c"
                  ,0x110,"int Cut_CutFilterOld(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  ppCVar6 = &pCVar7->pNext;
  do {
    pCVar7 = pList->pNext;
    if ((pCut->uSign & ~pList->uSign) == 0) {
      if (0xfffffff < *(uint *)pCut) {
        uVar3 = *(uint *)pList >> 0x1c;
        uVar4 = 0;
        do {
          uVar5 = 0;
          if (0xfffffff < *(uint *)pList) {
            uVar5 = 0;
            while (*(int *)(&pCut[1].field_0x0 + uVar4 * 4) !=
                   *(int *)(&pList[1].field_0x0 + uVar5 * 4)) {
              uVar5 = uVar5 + 1;
              if (uVar3 == uVar5) goto LAB_00454740;
            }
          }
          if ((uint)uVar5 == uVar3) goto LAB_00454740;
          uVar4 = uVar4 + 1;
        } while (uVar4 != *(uint *)pCut >> 0x1c);
      }
      p->nCutsFilter = p->nCutsFilter + 1;
      p->nNodeCuts = p->nNodeCuts + -1;
      *ppCVar6 = pList->pNext;
      Cut_CutRecycle(p,pList);
    }
    else {
LAB_00454740:
      ppCVar6 = &pList->pNext;
    }
    pList = pCVar7;
    if (pCVar7 == (Cut_Cut_t *)0x0) {
      if (*ppCVar6 == (Cut_Cut_t *)0x0) {
        return 0;
      }
      __assert_fail("*ppTail == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutNode.c"
                    ,0x129,"int Cut_CutFilterOld(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
    }
  } while( true );
}

Assistant:

static inline int Cut_CutFilterOld( Cut_Man_t * p, Cut_Cut_t * pList, Cut_Cut_t * pCut )
{
    Cut_Cut_t * pPrev, * pTemp, * pTemp2, ** ppTail;

    // check if this cut is filtered out by smaller cuts
    pPrev = NULL;
    Cut_ListForEachCut( pList, pTemp )
    {
        if ( pTemp->nLeaves > pCut->nLeaves )
            break;
        pPrev = pTemp;
        // skip the non-contained cuts
        if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
            continue;
        // check containment seriously
        if ( Cut_CutCheckDominance( pTemp, pCut ) )
        {
            p->nCutsFilter++;
            Cut_CutRecycle( p, pCut );
            return 1;
        }
    }
    assert( pPrev->pNext == pTemp );

    // filter out other cuts using this one
    ppTail = &pPrev->pNext;
    Cut_ListForEachCutSafe( pTemp, pTemp, pTemp2 )
    {
        // skip the non-contained cuts
        if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
        {
            ppTail = &pTemp->pNext;
            continue;
        }
        // check containment seriously
        if ( Cut_CutCheckDominance( pCut, pTemp ) )
        {
            p->nCutsFilter++;
            p->nNodeCuts--;
            // skip the given cut in the list
            *ppTail = pTemp->pNext;
            // recycle pTemp
            Cut_CutRecycle( p, pTemp );
        }
        else
            ppTail = &pTemp->pNext;
    }
    assert( *ppTail == NULL );
    return 0;
}